

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# barrier_test.cpp
# Opt level: O2

void __thiscall BarrierTest_CtorThrow_Test::TestBody(BarrierTest_CtorThrow_Test *this)

{
  bool bVar1;
  undefined4 *puVar2;
  AssertHelper AStack_58;
  char *local_50;
  undefined8 local_48;
  char local_40 [16];
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_30 [4];
  
  local_50 = local_40;
  local_40[0] = '\0';
  local_40[1] = '\0';
  local_40[2] = '\0';
  local_40[3] = '\0';
  local_40[4] = '\0';
  local_40[5] = '\0';
  local_40[6] = '\0';
  local_40[7] = '\0';
  local_40[8] = '\0';
  local_40[9] = '\0';
  local_40[10] = '\0';
  local_40[0xb] = '\0';
  local_40[0xc] = '\0';
  local_40[0xd] = '\0';
  local_40[0xe] = '\0';
  local_40[0xf] = '\0';
  local_48 = 0;
  bVar1 = testing::internal::AlwaysTrue();
  if (!bVar1) {
    std::__cxx11::string::assign((char *)&local_50);
    testing::Message::Message((Message *)local_30);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/tests/barrier_test.cpp"
               ,0x3e,local_50);
    testing::internal::AssertHelper::operator=(&AStack_58,(Message *)local_30);
    testing::internal::AssertHelper::~AssertHelper(&AStack_58);
    if (local_30[0]._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_30[0]._M_head_impl + 8))();
    }
    std::__cxx11::string::~string((string *)&local_50);
    return;
  }
  puVar2 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar2 = 0x2a;
  __cxa_throw(puVar2,&int::typeinfo,0);
}

Assistant:

TEST(BarrierTest, CtorThrow)
{
  struct throwing_completion {
    throwing_completion() = default;
    throwing_completion(const throwing_completion&) = default;
    throwing_completion(throwing_completion&&) {
      // move constructor throw exception
      throw 42;  // int
    }
    void operator()() {}
  } completion;
  EXPECT_THROW((yamc::barrier<throwing_completion>{1, completion}), int);
}